

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

pair<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>,_unsigned_long>
* __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::FindHelper
          (InnerMap *this,MapKey *k,TreeIterator *it)

{
  bool bVar1;
  iterator this_00;
  iterator m;
  undefined8 *in_RCX;
  _Base_ptr in_RDX;
  InnerMap *in_RSI;
  InnerMap *in_RDI;
  iterator tree_it;
  MapKey *key;
  Tree *tree;
  Node *node;
  size_type b;
  set<google::protobuf::MapKey_*,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
  *in_stack_fffffffffffffee8;
  InnerMap *in_stack_fffffffffffffef0;
  MapKey *in_stack_fffffffffffffef8;
  InnerMap *this_01;
  size_type in_stack_ffffffffffffff48;
  iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  local_40;
  Node *local_28;
  size_type local_20;
  undefined8 *local_18;
  _Base_ptr local_10;
  
  this_01 = in_RDI;
  local_18 = in_RCX;
  local_10 = in_RDX;
  local_20 = BucketNumber(in_RDI,in_stack_fffffffffffffef8);
  bVar1 = TableEntryIsNonEmptyList(in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8);
  if (bVar1) {
    local_28 = (Node *)in_RSI->table_[local_20];
    do {
      KeyPtrFromNodePtr((Node *)0x6f3b70);
      bVar1 = IsMatch(this_01,in_stack_fffffffffffffef8,(MapKey *)in_stack_fffffffffffffef0);
      if (bVar1) {
        iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
        ::iterator_base(&local_40,local_28,in_RSI,local_20);
        std::
        make_pair<google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::InnerMap::iterator_base<google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::KeyValuePair_const>,unsigned_long&>
                  ((iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
                    *)in_stack_fffffffffffffef0,(unsigned_long *)in_stack_fffffffffffffee8);
        return (pair<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>,_unsigned_long>
                *)in_RDI;
      }
      local_28 = local_28->next;
    } while (local_28 != (Node *)0x0);
    local_28 = (Node *)0x0;
  }
  else {
    bVar1 = TableEntryIsTree(in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8);
    if (bVar1) {
      local_20 = local_20 & 0xfffffffffffffffe;
      this_00 = std::
                set<google::protobuf::MapKey_*,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
                ::find((set<google::protobuf::MapKey_*,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
                        *)in_stack_fffffffffffffef8,(key_type *)in_stack_fffffffffffffef0);
      m = std::
          set<google::protobuf::MapKey_*,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
          ::end(in_stack_fffffffffffffee8);
      bVar1 = std::operator!=((_Self *)&stack0xffffffffffffff58,(_Self *)&stack0xffffffffffffff50);
      if (bVar1) {
        if (local_18 != (undefined8 *)0x0) {
          *local_18 = this_00._M_node;
        }
        iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
        ::iterator_base((iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
                         *)this_00._M_node,(TreeIterator)local_10,(InnerMap *)m._M_node,
                        in_stack_ffffffffffffff48);
        std::
        make_pair<google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::InnerMap::iterator_base<google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::KeyValuePair_const>,unsigned_long&>
                  ((iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
                    *)in_stack_fffffffffffffef0,(unsigned_long *)in_stack_fffffffffffffee8);
        return (pair<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>,_unsigned_long>
                *)in_RDI;
      }
    }
  }
  end(in_stack_fffffffffffffef0);
  std::
  make_pair<google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::InnerMap::iterator_base<google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::KeyValuePair_const>,unsigned_long&>
            ((iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
              *)in_stack_fffffffffffffef0,(unsigned_long *)in_stack_fffffffffffffee8);
  return (pair<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>,_unsigned_long>
          *)in_RDI;
}

Assistant:

std::pair<const_iterator, size_type> FindHelper(const Key& k,
                                                    TreeIterator* it) const {
      size_type b = BucketNumber(k);
      if (TableEntryIsNonEmptyList(b)) {
        Node* node = static_cast<Node*>(table_[b]);
        do {
          if (IsMatch(*KeyPtrFromNodePtr(node), k)) {
            return std::make_pair(const_iterator(node, this, b), b);
          } else {
            node = node->next;
          }
        } while (node != NULL);
      } else if (TableEntryIsTree(b)) {
        GOOGLE_DCHECK_EQ(table_[b], table_[b ^ 1]);
        b &= ~static_cast<size_t>(1);
        Tree* tree = static_cast<Tree*>(table_[b]);
        Key* key = const_cast<Key*>(&k);
        typename Tree::iterator tree_it = tree->find(key);
        if (tree_it != tree->end()) {
          if (it != NULL) *it = tree_it;
          return std::make_pair(const_iterator(tree_it, this, b), b);
        }
      }
      return std::make_pair(end(), b);
    }